

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8.h
# Opt level: O1

void ncnn::conv2x2s1_pack8_avx(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  int iVar45;
  uint uVar46;
  uint uVar47;
  int iVar48;
  void *pvVar49;
  float fVar50;
  float fVar51;
  int iVar52;
  int iVar53;
  undefined1 (*pauVar54) [32];
  float *pfVar55;
  long lVar56;
  uint uVar57;
  float *pfVar58;
  float *pfVar59;
  float *pfVar60;
  undefined1 (*pauVar61) [32];
  ulong uVar62;
  float fVar65;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar66 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  
  iVar45 = top_blob->c;
  if (0 < (long)iVar45) {
    uVar46 = bottom_blob->c;
    uVar47 = top_blob->w;
    iVar48 = top_blob->h;
    pvVar49 = _bias->data;
    lVar56 = 0;
    do {
      iVar52 = 1;
      if (top_blob->dims != 3) {
        iVar52 = top_blob->d;
      }
      if (pvVar49 == (void *)0x0) {
        auVar64 = ZEXT1632(ZEXT816(0) << 0x40);
      }
      else {
        auVar64 = *(undefined1 (*) [32])((long)pvVar49 + lVar56 * 0x20);
      }
      pauVar61 = (undefined1 (*) [32])
                 (top_blob->cstep * lVar56 * top_blob->elemsize + (long)top_blob->data);
      iVar52 = iVar52 * top_blob->h * top_blob->w;
      pauVar54 = pauVar61;
      if (0 < iVar52) {
        do {
          *pauVar54 = auVar64;
          iVar52 = iVar52 + -1;
          pauVar54 = pauVar54 + 1;
        } while (iVar52 != 0);
      }
      if (0 < (int)uVar46) {
        uVar62 = 0;
        do {
          if (0 < iVar48) {
            pfVar60 = (float *)((long)kernel->data +
                               kernel->elemsize * uVar62 * (long)kernel->w +
                               kernel->cstep * lVar56 * kernel->elemsize);
            pfVar55 = (float *)(bottom_blob->cstep * uVar62 * bottom_blob->elemsize +
                               (long)bottom_blob->data);
            pfVar58 = (float *)((long)bottom_blob->w * bottom_blob->elemsize + (long)pfVar55);
            iVar52 = 0;
            pauVar54 = pauVar61;
            do {
              if ((int)uVar47 < 2) {
                uVar57 = 0;
              }
              else {
                iVar53 = 1;
                do {
                  fVar1 = *pfVar55;
                  fVar2 = pfVar55[1];
                  fVar3 = pfVar55[2];
                  fVar4 = pfVar55[3];
                  fVar5 = pfVar55[4];
                  fVar6 = pfVar55[5];
                  fVar7 = pfVar55[6];
                  fVar8 = pfVar55[7];
                  fVar50 = pfVar60[0x17];
                  fVar72 = fVar2 + fVar3 + fVar3;
                  fVar70 = fVar1 + *(float *)((long)*pauVar54 + 0x1c) + fVar3;
                  fVar9 = pfVar55[8];
                  fVar10 = pfVar55[9];
                  fVar11 = pfVar55[10];
                  fVar12 = pfVar55[0xb];
                  fVar13 = pfVar55[0xc];
                  fVar14 = pfVar55[0xd];
                  fVar65 = pfVar60[7] + *(float *)(pauVar54[1] + 0x1c);
                  fVar15 = pfVar55[0xe];
                  fVar16 = pfVar55[0xf];
                  fVar17 = pfVar55[0x10];
                  fVar18 = pfVar55[0x11];
                  fVar19 = pfVar55[0x12];
                  fVar20 = pfVar55[0x13];
                  fVar21 = pfVar55[0x14];
                  fVar22 = pfVar55[0x15];
                  fVar23 = pfVar55[0x16];
                  fVar24 = pfVar55[0x17];
                  fVar25 = *pfVar58;
                  fVar26 = pfVar58[1];
                  fVar73 = fVar20 + fVar18 + pfVar60[0xf] + fVar50 + fVar50 + fVar65 + pfVar60[0x3f]
                           + fVar16;
                  fVar27 = pfVar58[2];
                  fVar28 = pfVar58[3];
                  fVar29 = pfVar58[4];
                  fVar77 = pfVar60[0x67] + fVar72 + fVar3 + fVar70 + fVar9 + fVar12 + fVar14;
                  fVar30 = pfVar58[5];
                  fVar51 = pfVar60[0x8f];
                  fVar74 = fVar70 + fVar72 + pfVar60[0x37] + fVar11 + fVar13 + fVar15 + fVar73;
                  fVar70 = pfVar58[6];
                  fVar72 = pfVar58[7];
                  fVar67 = pfVar58[8];
                  fVar68 = pfVar58[9];
                  fVar69 = pfVar58[10];
                  fVar71 = fVar73 + fVar15 + fVar51;
                  fVar73 = pfVar58[0xb];
                  fVar31 = pfVar58[0xc];
                  fVar32 = pfVar58[0xd];
                  fVar33 = pfVar58[0xe];
                  fVar34 = pfVar58[0xf];
                  fVar75 = fVar77 + fVar25 + fVar74 + fVar77 + fVar72 + pfVar60[0xb7];
                  auVar64 = *(undefined1 (*) [32])(pfVar60 + 0xd8);
                  fVar76 = fVar70 + fVar29 + fVar74 + fVar27 + fVar51 + fVar69;
                  auVar41 = *(undefined1 (*) [32])(pfVar60 + 0xe0);
                  auVar42 = *(undefined1 (*) [32])(pfVar60 + 0xe8);
                  auVar43 = *(undefined1 (*) [32])(pfVar60 + 0xf0);
                  auVar44 = *(undefined1 (*) [32])(pfVar60 + 0xf8);
                  fVar74 = pfVar58[0x10];
                  fVar77 = pfVar58[0x11];
                  fVar35 = pfVar58[0x12];
                  fVar36 = pfVar58[0x13];
                  fVar37 = pfVar58[0x14];
                  fVar38 = pfVar58[0x15];
                  fVar39 = pfVar58[0x16];
                  fVar40 = pfVar58[0x17];
                  auVar66._0_4_ =
                       fVar70 * pfVar60[0xb0] +
                       pfVar60[0xa0] * fVar29 +
                       *pfVar60 * fVar1 + *(float *)*pauVar54 + pfVar60[0x20] * fVar5 +
                       fVar7 * pfVar60[0x30] + pfVar60[0x40] * fVar9 + pfVar60[0x50] * fVar11 +
                       pfVar60[0x60] * fVar13 + pfVar60[0x70] * fVar15 + fVar25 * pfVar60[0x80] +
                       pfVar60[0x90] * fVar27 + fVar67 * pfVar60[0xc0] + pfVar60[0xd0] * fVar69 +
                       fVar31 * auVar41._0_4_ + auVar43._0_4_ * fVar33 +
                       auVar44._0_4_ * fVar34 +
                       fVar32 * auVar42._0_4_ +
                       pfVar60[0x78] * fVar16 +
                       pfVar60[8] * fVar2 + pfVar60[0x10] * fVar3 + pfVar60[0x18] * fVar4 +
                       pfVar60[0x28] * fVar6 + fVar8 * pfVar60[0x38] + pfVar60[0x48] * fVar10 +
                       pfVar60[0x58] * fVar12 + pfVar60[0x68] * fVar14 + fVar26 * pfVar60[0x88] +
                       pfVar60[0x98] * fVar28 + pfVar60[0xa8] * fVar30 + pfVar60[0xb8] * fVar72 +
                       fVar68 * pfVar60[200] + auVar64._0_4_ * fVar73;
                  auVar66._4_4_ =
                       fVar70 * pfVar60[0xb1] +
                       pfVar60[0xa1] * fVar29 +
                       pfVar60[1] * fVar1 + *(float *)((long)*pauVar54 + 4) + pfVar60[0x21] * fVar5
                       + fVar7 * pfVar60[0x31] + pfVar60[0x41] * fVar9 + pfVar60[0x51] * fVar11 +
                       pfVar60[0x61] * fVar13 + pfVar60[0x71] * fVar15 + fVar25 * pfVar60[0x81] +
                       pfVar60[0x91] * fVar27 + fVar67 * pfVar60[0xc1] + pfVar60[0xd1] * fVar69 +
                       fVar31 * auVar41._4_4_ + auVar43._4_4_ * fVar33 +
                       auVar44._4_4_ * fVar34 +
                       fVar32 * auVar42._4_4_ +
                       pfVar60[0x79] * fVar16 +
                       pfVar60[9] * fVar2 + pfVar60[0x11] * fVar3 + pfVar60[0x19] * fVar4 +
                       pfVar60[0x29] * fVar6 + fVar8 * pfVar60[0x39] + pfVar60[0x49] * fVar10 +
                       pfVar60[0x59] * fVar12 + pfVar60[0x69] * fVar14 + fVar26 * pfVar60[0x89] +
                       pfVar60[0x99] * fVar28 + pfVar60[0xa9] * fVar30 + pfVar60[0xb9] * fVar72 +
                       fVar68 * pfVar60[0xc9] + auVar64._4_4_ * fVar73;
                  auVar66._8_4_ =
                       fVar70 * pfVar60[0xb2] +
                       pfVar60[0xa2] * fVar29 +
                       pfVar60[2] * fVar1 + *(float *)((long)*pauVar54 + 8) + pfVar60[0x22] * fVar5
                       + fVar7 * pfVar60[0x32] + pfVar60[0x42] * fVar9 + pfVar60[0x52] * fVar11 +
                       pfVar60[0x62] * fVar13 + pfVar60[0x72] * fVar15 + fVar25 * pfVar60[0x82] +
                       pfVar60[0x92] * fVar27 + fVar67 * pfVar60[0xc2] + pfVar60[0xd2] * fVar69 +
                       fVar31 * auVar41._8_4_ + auVar43._8_4_ * fVar33 +
                       auVar44._8_4_ * fVar34 +
                       fVar32 * auVar42._8_4_ +
                       pfVar60[0x7a] * fVar16 +
                       pfVar60[10] * fVar2 + pfVar60[0x12] * fVar3 + pfVar60[0x1a] * fVar4 +
                       pfVar60[0x2a] * fVar6 + fVar8 * pfVar60[0x3a] + pfVar60[0x4a] * fVar10 +
                       pfVar60[0x5a] * fVar12 + pfVar60[0x6a] * fVar14 + fVar26 * pfVar60[0x8a] +
                       pfVar60[0x9a] * fVar28 + pfVar60[0xaa] * fVar30 + pfVar60[0xba] * fVar72 +
                       fVar68 * pfVar60[0xca] + auVar64._8_4_ * fVar73;
                  auVar66._12_4_ =
                       fVar70 * pfVar60[0xb3] +
                       pfVar60[0xa3] * fVar29 +
                       pfVar60[3] * fVar1 + *(float *)((long)*pauVar54 + 0xc) +
                       pfVar60[0x23] * fVar5 + fVar7 * pfVar60[0x33] + pfVar60[0x43] * fVar9 +
                       pfVar60[0x53] * fVar11 + pfVar60[99] * fVar13 + pfVar60[0x73] * fVar15 +
                       fVar25 * pfVar60[0x83] + pfVar60[0x93] * fVar27 + fVar67 * pfVar60[0xc3] +
                       pfVar60[0xd3] * fVar69 + fVar31 * auVar41._12_4_ + auVar43._12_4_ * fVar33 +
                       auVar44._12_4_ * fVar34 +
                       fVar32 * auVar42._12_4_ +
                       pfVar60[0x7b] * fVar16 +
                       pfVar60[0xb] * fVar2 + pfVar60[0x13] * fVar3 + pfVar60[0x1b] * fVar4 +
                       pfVar60[0x2b] * fVar6 + fVar8 * pfVar60[0x3b] + pfVar60[0x4b] * fVar10 +
                       pfVar60[0x5b] * fVar12 + pfVar60[0x6b] * fVar14 + fVar26 * pfVar60[0x8b] +
                       pfVar60[0x9b] * fVar28 + pfVar60[0xab] * fVar30 + pfVar60[0xbb] * fVar72 +
                       fVar68 * pfVar60[0xcb] + auVar64._12_4_ * fVar73;
                  auVar66._16_4_ =
                       fVar70 * pfVar60[0xb4] +
                       pfVar60[0xa4] * fVar29 +
                       pfVar60[4] * fVar1 + *(float *)((long)*pauVar54 + 0x10) +
                       pfVar60[0x24] * fVar5 + fVar7 * pfVar60[0x34] + pfVar60[0x44] * fVar9 +
                       pfVar60[0x54] * fVar11 + pfVar60[100] * fVar13 + pfVar60[0x74] * fVar15 +
                       fVar25 * pfVar60[0x84] + pfVar60[0x94] * fVar27 + fVar67 * pfVar60[0xc4] +
                       pfVar60[0xd4] * fVar69 + fVar31 * auVar41._16_4_ + auVar43._16_4_ * fVar33 +
                       auVar44._16_4_ * fVar34 +
                       fVar32 * auVar42._16_4_ +
                       pfVar60[0x7c] * fVar16 +
                       pfVar60[0xc] * fVar2 + pfVar60[0x14] * fVar3 + pfVar60[0x1c] * fVar4 +
                       pfVar60[0x2c] * fVar6 + fVar8 * pfVar60[0x3c] + pfVar60[0x4c] * fVar10 +
                       pfVar60[0x5c] * fVar12 + pfVar60[0x6c] * fVar14 + fVar26 * pfVar60[0x8c] +
                       pfVar60[0x9c] * fVar28 + pfVar60[0xac] * fVar30 + pfVar60[0xbc] * fVar72 +
                       fVar68 * pfVar60[0xcc] + auVar64._16_4_ * fVar73;
                  auVar66._20_4_ =
                       fVar70 * pfVar60[0xb5] +
                       pfVar60[0xa5] * fVar29 +
                       pfVar60[5] * fVar1 + *(float *)((long)*pauVar54 + 0x14) +
                       pfVar60[0x25] * fVar5 + fVar7 * pfVar60[0x35] + pfVar60[0x45] * fVar9 +
                       pfVar60[0x55] * fVar11 + pfVar60[0x65] * fVar13 + pfVar60[0x75] * fVar15 +
                       fVar25 * pfVar60[0x85] + pfVar60[0x95] * fVar27 + fVar67 * pfVar60[0xc5] +
                       pfVar60[0xd5] * fVar69 + fVar31 * auVar41._20_4_ + auVar43._20_4_ * fVar33 +
                       auVar44._20_4_ * fVar34 +
                       fVar32 * auVar42._20_4_ +
                       pfVar60[0x7d] * fVar16 +
                       pfVar60[0xd] * fVar2 + pfVar60[0x15] * fVar3 + pfVar60[0x1d] * fVar4 +
                       pfVar60[0x2d] * fVar6 + fVar8 * pfVar60[0x3d] + pfVar60[0x4d] * fVar10 +
                       pfVar60[0x5d] * fVar12 + pfVar60[0x6d] * fVar14 + fVar26 * pfVar60[0x8d] +
                       pfVar60[0x9d] * fVar28 + pfVar60[0xad] * fVar30 + pfVar60[0xbd] * fVar72 +
                       fVar68 * pfVar60[0xcd] + auVar64._20_4_ * fVar73;
                  auVar66._24_4_ =
                       fVar70 * pfVar60[0xb6] +
                       pfVar60[0xa6] * fVar29 +
                       pfVar60[6] * fVar1 + *(float *)((long)*pauVar54 + 0x18) +
                       pfVar60[0x26] * fVar5 + fVar7 * pfVar60[0x36] + pfVar60[0x46] * fVar9 +
                       pfVar60[0x56] * fVar11 + pfVar60[0x66] * fVar13 + pfVar60[0x76] * fVar15 +
                       fVar25 * pfVar60[0x86] + pfVar60[0x96] * fVar27 + fVar67 * pfVar60[0xc6] +
                       pfVar60[0xd6] * fVar69 + fVar31 * auVar41._24_4_ + auVar43._24_4_ * fVar33 +
                       auVar44._24_4_ * fVar34 +
                       fVar32 * auVar42._24_4_ +
                       pfVar60[0x7e] * fVar16 +
                       pfVar60[0xe] * fVar2 + pfVar60[0x16] * fVar3 + pfVar60[0x1e] * fVar4 +
                       pfVar60[0x2e] * fVar6 + fVar8 * pfVar60[0x3e] + pfVar60[0x4e] * fVar10 +
                       pfVar60[0x5e] * fVar12 + pfVar60[0x6e] * fVar14 + fVar26 * pfVar60[0x8e] +
                       pfVar60[0x9e] * fVar28 + pfVar60[0xae] * fVar30 + pfVar60[0xbe] * fVar72 +
                       fVar68 * pfVar60[0xce] + auVar64._24_4_ * fVar73;
                  auVar66._28_4_ = fVar76 + fVar75 + fVar33 + fVar34 + fVar76 + fVar75 + fVar73;
                  auVar63._0_4_ =
                       fVar74 * pfVar60[0xc0] +
                       fVar21 * pfVar60[0x60] +
                       fVar9 * *pfVar60 + *(float *)pauVar54[1] + pfVar60[0x20] * fVar13 +
                       fVar15 * pfVar60[0x30] + fVar17 * pfVar60[0x40] + fVar19 * pfVar60[0x50] +
                       fVar23 * pfVar60[0x70] + fVar67 * pfVar60[0x80] + fVar69 * pfVar60[0x90] +
                       fVar31 * pfVar60[0xa0] + fVar33 * pfVar60[0xb0] + fVar35 * pfVar60[0xd0] +
                       fVar37 * auVar41._0_4_ + auVar43._0_4_ * fVar39 +
                       fVar20 * pfVar60[0x58] +
                       fVar18 * pfVar60[0x48] +
                       fVar10 * pfVar60[8] + fVar11 * pfVar60[0x10] + pfVar60[0x18] * fVar12 +
                       pfVar60[0x28] * fVar14 + fVar16 * pfVar60[0x38] + fVar22 * pfVar60[0x68] +
                       fVar24 * pfVar60[0x78] + fVar68 * pfVar60[0x88] + pfVar60[0x98] * fVar73 +
                       fVar32 * pfVar60[0xa8] + fVar34 * pfVar60[0xb8] + fVar77 * pfVar60[200] +
                       fVar36 * auVar64._0_4_ + fVar38 * auVar42._0_4_ + auVar44._0_4_ * fVar40;
                  auVar63._4_4_ =
                       fVar74 * pfVar60[0xc1] +
                       fVar21 * pfVar60[0x61] +
                       fVar9 * pfVar60[1] + *(float *)(pauVar54[1] + 4) + pfVar60[0x21] * fVar13 +
                       fVar15 * pfVar60[0x31] + fVar17 * pfVar60[0x41] + fVar19 * pfVar60[0x51] +
                       fVar23 * pfVar60[0x71] + fVar67 * pfVar60[0x81] + fVar69 * pfVar60[0x91] +
                       fVar31 * pfVar60[0xa1] + fVar33 * pfVar60[0xb1] + fVar35 * pfVar60[0xd1] +
                       fVar37 * auVar41._4_4_ + auVar43._4_4_ * fVar39 +
                       fVar20 * pfVar60[0x59] +
                       fVar18 * pfVar60[0x49] +
                       fVar10 * pfVar60[9] + fVar11 * pfVar60[0x11] + pfVar60[0x19] * fVar12 +
                       pfVar60[0x29] * fVar14 + fVar16 * pfVar60[0x39] + fVar22 * pfVar60[0x69] +
                       fVar24 * pfVar60[0x79] + fVar68 * pfVar60[0x89] + pfVar60[0x99] * fVar73 +
                       fVar32 * pfVar60[0xa9] + fVar34 * pfVar60[0xb9] + fVar77 * pfVar60[0xc9] +
                       fVar36 * auVar64._4_4_ + fVar38 * auVar42._4_4_ + auVar44._4_4_ * fVar40;
                  auVar63._8_4_ =
                       fVar74 * pfVar60[0xc2] +
                       fVar21 * pfVar60[0x62] +
                       fVar9 * pfVar60[2] + *(float *)(pauVar54[1] + 8) + pfVar60[0x22] * fVar13 +
                       fVar15 * pfVar60[0x32] + fVar17 * pfVar60[0x42] + fVar19 * pfVar60[0x52] +
                       fVar23 * pfVar60[0x72] + fVar67 * pfVar60[0x82] + fVar69 * pfVar60[0x92] +
                       fVar31 * pfVar60[0xa2] + fVar33 * pfVar60[0xb2] + fVar35 * pfVar60[0xd2] +
                       fVar37 * auVar41._8_4_ + auVar43._8_4_ * fVar39 +
                       fVar20 * pfVar60[0x5a] +
                       fVar18 * pfVar60[0x4a] +
                       fVar10 * pfVar60[10] + fVar11 * pfVar60[0x12] + pfVar60[0x1a] * fVar12 +
                       pfVar60[0x2a] * fVar14 + fVar16 * pfVar60[0x3a] + fVar22 * pfVar60[0x6a] +
                       fVar24 * pfVar60[0x7a] + fVar68 * pfVar60[0x8a] + pfVar60[0x9a] * fVar73 +
                       fVar32 * pfVar60[0xaa] + fVar34 * pfVar60[0xba] + fVar77 * pfVar60[0xca] +
                       fVar36 * auVar64._8_4_ + fVar38 * auVar42._8_4_ + auVar44._8_4_ * fVar40;
                  auVar63._12_4_ =
                       fVar74 * pfVar60[0xc3] +
                       fVar21 * pfVar60[99] +
                       fVar9 * pfVar60[3] + *(float *)(pauVar54[1] + 0xc) + pfVar60[0x23] * fVar13 +
                       fVar15 * pfVar60[0x33] + fVar17 * pfVar60[0x43] + fVar19 * pfVar60[0x53] +
                       fVar23 * pfVar60[0x73] + fVar67 * pfVar60[0x83] + fVar69 * pfVar60[0x93] +
                       fVar31 * pfVar60[0xa3] + fVar33 * pfVar60[0xb3] + fVar35 * pfVar60[0xd3] +
                       fVar37 * auVar41._12_4_ + auVar43._12_4_ * fVar39 +
                       fVar20 * pfVar60[0x5b] +
                       fVar18 * pfVar60[0x4b] +
                       fVar10 * pfVar60[0xb] + fVar11 * pfVar60[0x13] + pfVar60[0x1b] * fVar12 +
                       pfVar60[0x2b] * fVar14 + fVar16 * pfVar60[0x3b] + fVar22 * pfVar60[0x6b] +
                       fVar24 * pfVar60[0x7b] + fVar68 * pfVar60[0x8b] + pfVar60[0x9b] * fVar73 +
                       fVar32 * pfVar60[0xab] + fVar34 * pfVar60[0xbb] + fVar77 * pfVar60[0xcb] +
                       fVar36 * auVar64._12_4_ + fVar38 * auVar42._12_4_ + auVar44._12_4_ * fVar40;
                  auVar63._16_4_ =
                       fVar74 * pfVar60[0xc4] +
                       fVar21 * pfVar60[100] +
                       fVar9 * pfVar60[4] + *(float *)(pauVar54[1] + 0x10) + pfVar60[0x24] * fVar13
                       + fVar15 * pfVar60[0x34] + fVar17 * pfVar60[0x44] + fVar19 * pfVar60[0x54] +
                       fVar23 * pfVar60[0x74] + fVar67 * pfVar60[0x84] + fVar69 * pfVar60[0x94] +
                       fVar31 * pfVar60[0xa4] + fVar33 * pfVar60[0xb4] + fVar35 * pfVar60[0xd4] +
                       fVar37 * auVar41._16_4_ + auVar43._16_4_ * fVar39 +
                       fVar20 * pfVar60[0x5c] +
                       fVar18 * pfVar60[0x4c] +
                       fVar10 * pfVar60[0xc] + fVar11 * pfVar60[0x14] + pfVar60[0x1c] * fVar12 +
                       pfVar60[0x2c] * fVar14 + fVar16 * pfVar60[0x3c] + fVar22 * pfVar60[0x6c] +
                       fVar24 * pfVar60[0x7c] + fVar68 * pfVar60[0x8c] + pfVar60[0x9c] * fVar73 +
                       fVar32 * pfVar60[0xac] + fVar34 * pfVar60[0xbc] + fVar77 * pfVar60[0xcc] +
                       fVar36 * auVar64._16_4_ + fVar38 * auVar42._16_4_ + auVar44._16_4_ * fVar40;
                  auVar63._20_4_ =
                       fVar74 * pfVar60[0xc5] +
                       fVar21 * pfVar60[0x65] +
                       fVar9 * pfVar60[5] + *(float *)(pauVar54[1] + 0x14) + pfVar60[0x25] * fVar13
                       + fVar15 * pfVar60[0x35] + fVar17 * pfVar60[0x45] + fVar19 * pfVar60[0x55] +
                       fVar23 * pfVar60[0x75] + fVar67 * pfVar60[0x85] + fVar69 * pfVar60[0x95] +
                       fVar31 * pfVar60[0xa5] + fVar33 * pfVar60[0xb5] + fVar35 * pfVar60[0xd5] +
                       fVar37 * auVar41._20_4_ + auVar43._20_4_ * fVar39 +
                       fVar20 * pfVar60[0x5d] +
                       fVar18 * pfVar60[0x4d] +
                       fVar10 * pfVar60[0xd] + fVar11 * pfVar60[0x15] + pfVar60[0x1d] * fVar12 +
                       pfVar60[0x2d] * fVar14 + fVar16 * pfVar60[0x3d] + fVar22 * pfVar60[0x6d] +
                       fVar24 * pfVar60[0x7d] + fVar68 * pfVar60[0x8d] + pfVar60[0x9d] * fVar73 +
                       fVar32 * pfVar60[0xad] + fVar34 * pfVar60[0xbd] + fVar77 * pfVar60[0xcd] +
                       fVar36 * auVar64._20_4_ + fVar38 * auVar42._20_4_ + auVar44._20_4_ * fVar40;
                  auVar63._24_4_ =
                       fVar74 * pfVar60[0xc6] +
                       fVar21 * pfVar60[0x66] +
                       fVar9 * pfVar60[6] + *(float *)(pauVar54[1] + 0x18) + pfVar60[0x26] * fVar13
                       + fVar15 * pfVar60[0x36] + fVar17 * pfVar60[0x46] + fVar19 * pfVar60[0x56] +
                       fVar23 * pfVar60[0x76] + fVar67 * pfVar60[0x86] + fVar69 * pfVar60[0x96] +
                       fVar31 * pfVar60[0xa6] + fVar33 * pfVar60[0xb6] + fVar35 * pfVar60[0xd6] +
                       fVar37 * auVar41._24_4_ + auVar43._24_4_ * fVar39 +
                       fVar20 * pfVar60[0x5e] +
                       fVar18 * pfVar60[0x4e] +
                       fVar10 * pfVar60[0xe] + fVar11 * pfVar60[0x16] + pfVar60[0x1e] * fVar12 +
                       pfVar60[0x2e] * fVar14 + fVar16 * pfVar60[0x3e] + fVar22 * pfVar60[0x6e] +
                       fVar24 * pfVar60[0x7e] + fVar68 * pfVar60[0x8e] + pfVar60[0x9e] * fVar73 +
                       fVar32 * pfVar60[0xae] + fVar34 * pfVar60[0xbe] + fVar77 * pfVar60[0xce] +
                       fVar36 * auVar64._24_4_ + fVar38 * auVar42._24_4_ + auVar44._24_4_ * fVar40;
                  auVar63._28_4_ =
                       fVar74 + fVar21 + fVar65 + fVar50 + pfVar60[0x37] + fVar17 + pfVar60[0x57] +
                                fVar16 + pfVar60[0x87] + pfVar60[0x97] + fVar71 + fVar51 + fVar35 +
                       fVar35 + fVar35 +
                       fVar71 + pfVar60[0x97] + fVar51 + fVar51 + pfVar60[0xcf] + fVar35 + fVar35 +
                       fVar35;
                  *pauVar54 = auVar66;
                  pauVar54[1] = auVar63;
                  pfVar55 = pfVar55 + 0x10;
                  pfVar58 = pfVar58 + 0x10;
                  pauVar54 = pauVar54 + 2;
                  iVar53 = iVar53 + 2;
                  uVar57 = uVar47 & 0xfffffffe;
                } while (iVar53 < (int)uVar47);
              }
              iVar53 = uVar47 - uVar57;
              pfVar59 = pfVar58;
              if (iVar53 != 0 && (int)uVar57 <= (int)uVar47) {
                do {
                  fVar1 = *pfVar55;
                  fVar2 = pfVar55[1];
                  fVar3 = pfVar55[2];
                  fVar4 = pfVar55[3];
                  fVar5 = pfVar55[4];
                  fVar6 = pfVar55[5];
                  fVar7 = pfVar55[6];
                  fVar8 = pfVar55[7];
                  fVar67 = fVar2 + fVar3 + fVar3 + fVar4;
                  fVar9 = pfVar55[8];
                  fVar10 = pfVar55[9];
                  fVar11 = pfVar55[10];
                  fVar12 = pfVar55[0xb];
                  fVar13 = pfVar55[0xc];
                  fVar14 = pfVar55[0xd];
                  fVar15 = pfVar55[0xe];
                  fVar16 = pfVar55[0xf];
                  fVar68 = fVar3 + fVar67 + fVar9 + fVar10;
                  fVar69 = fVar9 + fVar68 + fVar9 + fVar10 + fVar9;
                  fVar17 = *pfVar59;
                  fVar18 = pfVar59[1];
                  fVar19 = pfVar59[2];
                  fVar20 = pfVar59[3];
                  fVar21 = pfVar59[4];
                  fVar22 = pfVar59[5];
                  fVar23 = pfVar59[6];
                  fVar24 = pfVar59[7];
                  pfVar55 = pfVar55 + 8;
                  pfVar58 = pfVar59 + 8;
                  fVar25 = pfVar59[8];
                  fVar26 = pfVar59[9];
                  fVar27 = pfVar59[10];
                  fVar28 = pfVar59[0xb];
                  fVar29 = pfVar59[0xc];
                  fVar30 = pfVar59[0xd];
                  fVar70 = pfVar59[0xe];
                  fVar72 = pfVar59[0xf];
                  fVar73 = fVar17 + fVar18 + fVar17 + fVar25 + fVar25 + fVar25 + fVar26;
                  auVar64._0_4_ =
                       fVar1 * *pfVar60 + *(float *)*pauVar54 +
                       fVar2 * pfVar60[8] + fVar3 * pfVar60[0x10] +
                       fVar4 * pfVar60[0x18] + fVar5 * pfVar60[0x20] + fVar6 * pfVar60[0x28] +
                       fVar7 * pfVar60[0x30] + fVar8 * pfVar60[0x38] + fVar9 * pfVar60[0x40] +
                       fVar10 * pfVar60[0x48] +
                       fVar11 * pfVar60[0x50] + fVar12 * pfVar60[0x58] + fVar13 * pfVar60[0x60] +
                       fVar14 * pfVar60[0x68] + fVar15 * pfVar60[0x70] +
                       fVar16 * pfVar60[0x78] + fVar17 * pfVar60[0x80] + fVar18 * pfVar60[0x88] +
                       fVar19 * pfVar60[0x90] + fVar20 * pfVar60[0x98] + fVar21 * pfVar60[0xa0] +
                       fVar22 * pfVar60[0xa8] + fVar23 * pfVar60[0xb0] + fVar24 * pfVar60[0xb8] +
                       fVar25 * pfVar60[0xc0] + fVar26 * pfVar60[200] + fVar27 * pfVar60[0xd0] +
                       fVar28 * pfVar60[0xd8] +
                       fVar29 * pfVar60[0xe0] + fVar30 * pfVar60[0xe8] + fVar70 * pfVar60[0xf0] +
                       fVar72 * pfVar60[0xf8];
                  auVar64._4_4_ =
                       fVar1 * pfVar60[1] + *(float *)((long)*pauVar54 + 4) +
                       fVar2 * pfVar60[9] + fVar3 * pfVar60[0x11] +
                       fVar4 * pfVar60[0x19] + fVar5 * pfVar60[0x21] + fVar6 * pfVar60[0x29] +
                       fVar7 * pfVar60[0x31] + fVar8 * pfVar60[0x39] + fVar9 * pfVar60[0x41] +
                       fVar10 * pfVar60[0x49] +
                       fVar11 * pfVar60[0x51] + fVar12 * pfVar60[0x59] + fVar13 * pfVar60[0x61] +
                       fVar14 * pfVar60[0x69] + fVar15 * pfVar60[0x71] +
                       fVar16 * pfVar60[0x79] + fVar17 * pfVar60[0x81] + fVar18 * pfVar60[0x89] +
                       fVar19 * pfVar60[0x91] + fVar20 * pfVar60[0x99] + fVar21 * pfVar60[0xa1] +
                       fVar22 * pfVar60[0xa9] + fVar23 * pfVar60[0xb1] + fVar24 * pfVar60[0xb9] +
                       fVar25 * pfVar60[0xc1] + fVar26 * pfVar60[0xc9] + fVar27 * pfVar60[0xd1] +
                       fVar28 * pfVar60[0xd9] +
                       fVar29 * pfVar60[0xe1] + fVar30 * pfVar60[0xe9] + fVar70 * pfVar60[0xf1] +
                       fVar72 * pfVar60[0xf9];
                  auVar64._8_4_ =
                       fVar1 * pfVar60[2] + *(float *)((long)*pauVar54 + 8) +
                       fVar2 * pfVar60[10] + fVar3 * pfVar60[0x12] +
                       fVar4 * pfVar60[0x1a] + fVar5 * pfVar60[0x22] + fVar6 * pfVar60[0x2a] +
                       fVar7 * pfVar60[0x32] + fVar8 * pfVar60[0x3a] + fVar9 * pfVar60[0x42] +
                       fVar10 * pfVar60[0x4a] +
                       fVar11 * pfVar60[0x52] + fVar12 * pfVar60[0x5a] + fVar13 * pfVar60[0x62] +
                       fVar14 * pfVar60[0x6a] + fVar15 * pfVar60[0x72] +
                       fVar16 * pfVar60[0x7a] + fVar17 * pfVar60[0x82] + fVar18 * pfVar60[0x8a] +
                       fVar19 * pfVar60[0x92] + fVar20 * pfVar60[0x9a] + fVar21 * pfVar60[0xa2] +
                       fVar22 * pfVar60[0xaa] + fVar23 * pfVar60[0xb2] + fVar24 * pfVar60[0xba] +
                       fVar25 * pfVar60[0xc2] + fVar26 * pfVar60[0xca] + fVar27 * pfVar60[0xd2] +
                       fVar28 * pfVar60[0xda] +
                       fVar29 * pfVar60[0xe2] + fVar30 * pfVar60[0xea] + fVar70 * pfVar60[0xf2] +
                       fVar72 * pfVar60[0xfa];
                  auVar64._12_4_ =
                       fVar1 * pfVar60[3] + *(float *)((long)*pauVar54 + 0xc) +
                       fVar2 * pfVar60[0xb] + fVar3 * pfVar60[0x13] +
                       fVar4 * pfVar60[0x1b] + fVar5 * pfVar60[0x23] + fVar6 * pfVar60[0x2b] +
                       fVar7 * pfVar60[0x33] + fVar8 * pfVar60[0x3b] + fVar9 * pfVar60[0x43] +
                       fVar10 * pfVar60[0x4b] +
                       fVar11 * pfVar60[0x53] + fVar12 * pfVar60[0x5b] + fVar13 * pfVar60[99] +
                       fVar14 * pfVar60[0x6b] + fVar15 * pfVar60[0x73] +
                       fVar16 * pfVar60[0x7b] + fVar17 * pfVar60[0x83] + fVar18 * pfVar60[0x8b] +
                       fVar19 * pfVar60[0x93] + fVar20 * pfVar60[0x9b] + fVar21 * pfVar60[0xa3] +
                       fVar22 * pfVar60[0xab] + fVar23 * pfVar60[0xb3] + fVar24 * pfVar60[0xbb] +
                       fVar25 * pfVar60[0xc3] + fVar26 * pfVar60[0xcb] + fVar27 * pfVar60[0xd3] +
                       fVar28 * pfVar60[0xdb] +
                       fVar29 * pfVar60[0xe3] + fVar30 * pfVar60[0xeb] + fVar70 * pfVar60[0xf3] +
                       fVar72 * pfVar60[0xfb];
                  auVar64._16_4_ =
                       fVar1 * pfVar60[4] + *(float *)((long)*pauVar54 + 0x10) +
                       fVar2 * pfVar60[0xc] + fVar3 * pfVar60[0x14] +
                       fVar4 * pfVar60[0x1c] + fVar5 * pfVar60[0x24] + fVar6 * pfVar60[0x2c] +
                       fVar7 * pfVar60[0x34] + fVar8 * pfVar60[0x3c] + fVar9 * pfVar60[0x44] +
                       fVar10 * pfVar60[0x4c] +
                       fVar11 * pfVar60[0x54] + fVar12 * pfVar60[0x5c] + fVar13 * pfVar60[100] +
                       fVar14 * pfVar60[0x6c] + fVar15 * pfVar60[0x74] +
                       fVar16 * pfVar60[0x7c] + fVar17 * pfVar60[0x84] + fVar18 * pfVar60[0x8c] +
                       fVar19 * pfVar60[0x94] + fVar20 * pfVar60[0x9c] + fVar21 * pfVar60[0xa4] +
                       fVar22 * pfVar60[0xac] + fVar23 * pfVar60[0xb4] + fVar24 * pfVar60[0xbc] +
                       fVar25 * pfVar60[0xc4] + fVar26 * pfVar60[0xcc] + fVar27 * pfVar60[0xd4] +
                       fVar28 * pfVar60[0xdc] +
                       fVar29 * pfVar60[0xe4] + fVar30 * pfVar60[0xec] + fVar70 * pfVar60[0xf4] +
                       fVar72 * pfVar60[0xfc];
                  auVar64._20_4_ =
                       fVar1 * pfVar60[5] + *(float *)((long)*pauVar54 + 0x14) +
                       fVar2 * pfVar60[0xd] + fVar3 * pfVar60[0x15] +
                       fVar4 * pfVar60[0x1d] + fVar5 * pfVar60[0x25] + fVar6 * pfVar60[0x2d] +
                       fVar7 * pfVar60[0x35] + fVar8 * pfVar60[0x3d] + fVar9 * pfVar60[0x45] +
                       fVar10 * pfVar60[0x4d] +
                       fVar11 * pfVar60[0x55] + fVar12 * pfVar60[0x5d] + fVar13 * pfVar60[0x65] +
                       fVar14 * pfVar60[0x6d] + fVar15 * pfVar60[0x75] +
                       fVar16 * pfVar60[0x7d] + fVar17 * pfVar60[0x85] + fVar18 * pfVar60[0x8d] +
                       fVar19 * pfVar60[0x95] + fVar20 * pfVar60[0x9d] + fVar21 * pfVar60[0xa5] +
                       fVar22 * pfVar60[0xad] + fVar23 * pfVar60[0xb5] + fVar24 * pfVar60[0xbd] +
                       fVar25 * pfVar60[0xc5] + fVar26 * pfVar60[0xcd] + fVar27 * pfVar60[0xd5] +
                       fVar28 * pfVar60[0xdd] +
                       fVar29 * pfVar60[0xe5] + fVar30 * pfVar60[0xed] + fVar70 * pfVar60[0xf5] +
                       fVar72 * pfVar60[0xfd];
                  auVar64._24_4_ =
                       fVar1 * pfVar60[6] + *(float *)((long)*pauVar54 + 0x18) +
                       fVar2 * pfVar60[0xe] + fVar3 * pfVar60[0x16] +
                       fVar4 * pfVar60[0x1e] + fVar5 * pfVar60[0x26] + fVar6 * pfVar60[0x2e] +
                       fVar7 * pfVar60[0x36] + fVar8 * pfVar60[0x3e] + fVar9 * pfVar60[0x46] +
                       fVar10 * pfVar60[0x4e] +
                       fVar11 * pfVar60[0x56] + fVar12 * pfVar60[0x5e] + fVar13 * pfVar60[0x66] +
                       fVar14 * pfVar60[0x6e] + fVar15 * pfVar60[0x76] +
                       fVar16 * pfVar60[0x7e] + fVar17 * pfVar60[0x86] + fVar18 * pfVar60[0x8e] +
                       fVar19 * pfVar60[0x96] + fVar20 * pfVar60[0x9e] + fVar21 * pfVar60[0xa6] +
                       fVar22 * pfVar60[0xae] + fVar23 * pfVar60[0xb6] + fVar24 * pfVar60[0xbe] +
                       fVar25 * pfVar60[0xc6] + fVar26 * pfVar60[0xce] + fVar27 * pfVar60[0xd6] +
                       fVar28 * pfVar60[0xde] +
                       fVar29 * pfVar60[0xe6] + fVar30 * pfVar60[0xee] + fVar70 * pfVar60[0xf6] +
                       fVar72 * pfVar60[0xfe];
                  auVar64._28_4_ =
                       fVar1 + *(float *)((long)*pauVar54 + 0x1c) + fVar2 + fVar3 + fVar67 + fVar68
                       + fVar69 + fVar69 + fVar17 + fVar17 + fVar18 + fVar17 + fVar17 + fVar73 +
                       fVar25 + fVar73 + fVar25 + fVar26;
                  *pauVar54 = auVar64;
                  pauVar54 = pauVar54 + 1;
                  iVar53 = iVar53 + -1;
                  pfVar59 = pfVar58;
                } while (iVar53 != 0);
              }
              pfVar55 = pfVar55 + 8;
              pfVar58 = pfVar58 + 8;
              iVar52 = iVar52 + 1;
            } while (iVar52 != iVar48);
          }
          uVar62 = uVar62 + 1;
        } while (uVar62 != uVar46);
      }
      lVar56 = lVar56 + 1;
    } while (lVar56 != iVar45);
  }
  return;
}

Assistant:

static void conv2x2s1_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int inch = bottom_blob.c;
    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out0 = top_blob.channel(p);

        __m256 _bias0 = bias ? _mm256_loadu_ps((const float*)bias + p * 8) : _mm256_set1_ps(0.f);
        out0.fill(_bias0);

        for (int q = 0; q < inch; q++)
        {
            float* outptr0 = out0.row(0);

            const Mat img0 = bottom_blob.channel(q);

            const float* r0 = img0.row(0);
            const float* r1 = img0.row(1);

            const float* kptr = (const float*)kernel.channel(p).row(q);
            // const float* kptr = (const float*)kernel + 4 * inch * p * 64;

            int i = 0;
            for (; i < outh; i++)
            {
                int j = 0;

                for (; j + 1 < outw; j += 2)
                {
                    __m256 _sum0 = _mm256_loadu_ps(outptr0);
                    __m256 _sum1 = _mm256_loadu_ps(outptr0 + 8);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    //========================================

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);
                    r0 += 8;

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k00, _r00, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k01, _r01, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k02, _r02, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k03, _r03, _sum0);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k04, _r04, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k05, _r05, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k06, _r06, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k07, _r07, _sum0);

                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k00, _r00, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k01, _r01, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k02, _r02, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k03, _r03, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k04, _r04, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k05, _r05, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k06, _r06, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k07, _r07, _sum1);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum0 = _mm256_comp_fmadd_ps(_k10, _r10, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k11, _r11, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k12, _r12, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k13, _r13, _sum0);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum0 = _mm256_comp_fmadd_ps(_k14, _r14, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k15, _r15, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k16, _r16, _sum0);
                    _sum0 = _mm256_comp_fmadd_ps(_k17, _r17, _sum0);

                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _sum1 = _mm256_comp_fmadd_ps(_k10, _r10, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k11, _r11, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k12, _r12, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k13, _r13, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k14, _r14, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k15, _r15, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k16, _r16, _sum1);
                    _sum1 = _mm256_comp_fmadd_ps(_k17, _r17, _sum1);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum0);
                    _mm256_storeu_ps(outptr0 + 8, _sum1);
                    outptr0 += 16;
                }

                for (; j < outw; j++)
                {
                    __m256 _sum = _mm256_loadu_ps(outptr0);

                    __m256 _r00 = _mm256_broadcast_ss(r0);
                    __m256 _r01 = _mm256_broadcast_ss(r0 + 1);
                    __m256 _r02 = _mm256_broadcast_ss(r0 + 2);
                    __m256 _r03 = _mm256_broadcast_ss(r0 + 3);
                    __m256 _r04 = _mm256_broadcast_ss(r0 + 4);
                    __m256 _r05 = _mm256_broadcast_ss(r0 + 5);
                    __m256 _r06 = _mm256_broadcast_ss(r0 + 6);
                    __m256 _r07 = _mm256_broadcast_ss(r0 + 7);

                    __m256 _k00 = _mm256_loadu_ps(kptr);
                    __m256 _k01 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k02 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    __m256 _k04 = _mm256_loadu_ps(kptr);
                    __m256 _k05 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k06 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);

                    //========================================
                    r0 += 8;
                    _r00 = _mm256_broadcast_ss(r0);
                    _r01 = _mm256_broadcast_ss(r0 + 1);
                    _r02 = _mm256_broadcast_ss(r0 + 2);
                    _r03 = _mm256_broadcast_ss(r0 + 3);
                    _r04 = _mm256_broadcast_ss(r0 + 4);
                    _r05 = _mm256_broadcast_ss(r0 + 5);
                    _r06 = _mm256_broadcast_ss(r0 + 6);
                    _r07 = _mm256_broadcast_ss(r0 + 7);

                    _k00 = _mm256_loadu_ps(kptr);
                    _k01 = _mm256_loadu_ps(kptr + 8);
                    _k02 = _mm256_loadu_ps(kptr + 16);
                    _k03 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k00, _r00, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k01, _r01, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k02, _r02, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k03, _r03, _sum);

                    _k04 = _mm256_loadu_ps(kptr);
                    _k05 = _mm256_loadu_ps(kptr + 8);
                    _k06 = _mm256_loadu_ps(kptr + 16);
                    _k07 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k04, _r04, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k05, _r05, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k06, _r06, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k07, _r07, _sum);
                    //===============

                    __m256 _r10 = _mm256_broadcast_ss(r1);
                    __m256 _r11 = _mm256_broadcast_ss(r1 + 1);
                    __m256 _r12 = _mm256_broadcast_ss(r1 + 2);
                    __m256 _r13 = _mm256_broadcast_ss(r1 + 3);
                    __m256 _r14 = _mm256_broadcast_ss(r1 + 4);
                    __m256 _r15 = _mm256_broadcast_ss(r1 + 5);
                    __m256 _r16 = _mm256_broadcast_ss(r1 + 6);
                    __m256 _r17 = _mm256_broadcast_ss(r1 + 7);

                    __m256 _k10 = _mm256_loadu_ps(kptr);
                    __m256 _k11 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k12 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    __m256 _k14 = _mm256_loadu_ps(kptr);
                    __m256 _k15 = _mm256_loadu_ps(kptr + 8);
                    __m256 _k16 = _mm256_loadu_ps(kptr + 16);
                    __m256 _k17 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    //=======================================
                    r1 += 8;
                    _r10 = _mm256_broadcast_ss(r1);
                    _r11 = _mm256_broadcast_ss(r1 + 1);
                    _r12 = _mm256_broadcast_ss(r1 + 2);
                    _r13 = _mm256_broadcast_ss(r1 + 3);
                    _r14 = _mm256_broadcast_ss(r1 + 4);
                    _r15 = _mm256_broadcast_ss(r1 + 5);
                    _r16 = _mm256_broadcast_ss(r1 + 6);
                    _r17 = _mm256_broadcast_ss(r1 + 7);

                    _k10 = _mm256_loadu_ps(kptr);
                    _k11 = _mm256_loadu_ps(kptr + 8);
                    _k12 = _mm256_loadu_ps(kptr + 16);
                    _k13 = _mm256_loadu_ps(kptr + 24);
                    kptr += 32;

                    _sum = _mm256_comp_fmadd_ps(_k10, _r10, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k11, _r11, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k12, _r12, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k13, _r13, _sum);

                    _k14 = _mm256_loadu_ps(kptr);
                    _k15 = _mm256_loadu_ps(kptr + 8);
                    _k16 = _mm256_loadu_ps(kptr + 16);
                    _k17 = _mm256_loadu_ps(kptr + 24);
                    _sum = _mm256_comp_fmadd_ps(_k14, _r14, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k15, _r15, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k16, _r16, _sum);
                    _sum = _mm256_comp_fmadd_ps(_k17, _r17, _sum);

                    kptr -= 224;
                    _mm256_storeu_ps(outptr0, _sum);
                    outptr0 += 8;
                }

                r0 += 8;
                r1 += 8;
            }
        }
    }
}